

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execCmp<(moira::Instr)37,(moira::Mode)8,(moira::Size)2>(Moira *this,u16 opcode)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  u32 data;
  u32 ea;
  u32 local_18;
  u32 local_14;
  
  local_18 = (u32)CONCAT71(in_register_00000001,in_AL);
  bVar1 = readOp<(moira::Mode)8,(moira::Size)2,0ul>(this,opcode & 7,&local_14,&local_18);
  if (bVar1) {
    cmp<(moira::Size)2>(this,local_18,
                        (uint)*(ushort *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58));
    prefetch<4ul>(this);
  }
  return;
}

Assistant:

void
Moira::execCmp(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    cmp<S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
}